

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

FunctionInfo * __thiscall
Js::DynamicProfileInfo::GetCallApplyTargetInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId)

{
  ushort uVar1;
  CallSiteInfo *pCVar2;
  code *pcVar3;
  bool bVar4;
  ProfileId PVar5;
  undefined4 *puVar6;
  unsigned_short *puVar7;
  FunctionInfo *pFVar8;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x48f,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar4) goto LAB_00887934;
    *puVar6 = 0;
  }
  if (functionBody->profiledCallSiteCount <= callSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x491,"(callSiteId < callSiteCount)","callSiteId < callSiteCount");
    if (!bVar4) goto LAB_00887934;
    *puVar6 = 0;
  }
  if (((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x44 & 0xc) == 0) {
    bVar4 = HasCallSiteInfo(functionBody);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x492,
                                  "(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody))"
                                  ,
                                  "functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody)"
                                 );
      if (!bVar4) goto LAB_00887934;
      *puVar6 = 0;
    }
  }
  puVar7 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
                     ((FunctionProxy *)functionBody);
  if (puVar7 != (unsigned_short *)0x0) {
    puVar7 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
                       ((FunctionProxy *)functionBody);
    uVar1 = puVar7[callSiteId];
    if (uVar1 != 0xffff) {
      PVar5 = FunctionBody::GetProfiledCallApplyCallSiteCount(functionBody);
      if (PVar5 <= uVar1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                    ,0x49c,
                                    "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                    ,
                                    "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                                   );
        if (!bVar4) {
LAB_00887934:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      pCVar2 = (this->callApplyTargetInfo).ptr;
      if (-1 < *(short *)&pCVar2[uVar1].field_0x2) {
        pFVar8 = GetFunctionInfo(functionBody,pCVar2[uVar1].u.functionData.sourceId,
                                 pCVar2[uVar1].u.functionData.functionId);
        return pFVar8;
      }
    }
  }
  return (FunctionInfo *)0x0;
}

Assistant:

FunctionInfo * DynamicProfileInfo::GetCallApplyTargetInfo(FunctionBody * functionBody, ProfileId callSiteId)
    {
        Assert(functionBody != nullptr);
        Js::ProfileId callSiteCount = functionBody->GetProfiledCallSiteCount();
        Assert(callSiteId < callSiteCount);
        Assert(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody));

        if (functionBody->GetCallSiteToCallApplyCallSiteArray())
        {
            Js::ProfileId callApplyCallSiteId = functionBody->GetCallSiteToCallApplyCallSiteArray()[callSiteId];
            if (callApplyCallSiteId == Js::Constants::NoProfileId)
            {
                return nullptr;
            } 
            
            Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());
            
            if (callApplyTargetInfo[callApplyCallSiteId].isPolymorphic)
            {
                return nullptr;
            }

            return GetFunctionInfo(functionBody, callApplyTargetInfo[callApplyCallSiteId].u.functionData.sourceId, callApplyTargetInfo[callApplyCallSiteId].u.functionData.functionId);
        }

        return nullptr;
    }